

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t archive_read_format_lha_read_data_skip(archive_read *a)

{
  long lVar1;
  int64_t iVar2;
  long in_RDI;
  int64_t bytes_skipped;
  lha *lha;
  int64_t in_stack_ffffffffffffffd8;
  archive_read *in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  lVar1 = **(long **)(in_RDI + 0x948);
  if (*(long *)(lVar1 + 0x10) != 0) {
    __archive_read_consume(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    *(undefined8 *)(lVar1 + 0x10) = 0;
  }
  if (*(char *)(lVar1 + 0x125) == '\0') {
    iVar2 = __archive_read_consume(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    if (iVar2 < 0) {
      local_4 = L'\xffffffe2';
    }
    else {
      *(undefined1 *)(lVar1 + 0x124) = 1;
      *(undefined1 *)(lVar1 + 0x125) = 1;
      local_4 = L'\0';
    }
  }
  else {
    local_4 = L'\0';
  }
  return local_4;
}

Assistant:

static int
archive_read_format_lha_read_data_skip(struct archive_read *a)
{
	struct lha *lha;
	int64_t bytes_skipped;

	lha = (struct lha *)(a->format->data);

	if (lha->entry_unconsumed) {
		/* Consume as much as the decompressor actually used. */
		__archive_read_consume(a, lha->entry_unconsumed);
		lha->entry_unconsumed = 0;
	}

	/* if we've already read to end of data, we're done. */
	if (lha->end_of_entry_cleanup)
		return (ARCHIVE_OK);

	/*
	 * If the length is at the beginning, we can skip the
	 * compressed data much more quickly.
	 */
	bytes_skipped = __archive_read_consume(a, lha->entry_bytes_remaining);
	if (bytes_skipped < 0)
		return (ARCHIVE_FATAL);

	/* This entry is finished and done. */
	lha->end_of_entry_cleanup = lha->end_of_entry = 1;
	return (ARCHIVE_OK);
}